

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O0

MPP_RET os_allocator_drm_import(void *ctx,MppBufferInfo *data)

{
  int fd;
  RK_S32 RVar1;
  MPP_RET local_28;
  MPP_RET ret;
  RK_S32 fd_ext;
  allocator_ctx_drm *p;
  MppBufferInfo *data_local;
  void *ctx_local;
  
  fd = data->fd;
  local_28 = MPP_OK;
  if ((drm_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_drm","enter dev %d\n","os_allocator_drm_import",
               (ulong)*(uint *)((long)ctx + 4));
  }
  if ((fd < 1) &&
     (_mpp_log_l(2,"mpp_drm","Assertion %s failed at %s:%d\n",(char *)0x0,"fd_ext > 0",
                 "os_allocator_drm_import",0x10e), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  RVar1 = mpp_dup(fd);
  data->fd = RVar1;
  data->ptr = (void *)0x0;
  if (data->fd < 1) {
    _mpp_log_l(2,"mpp_drm"," fd dup return invalid fd %d\n","os_allocator_drm_import",
               (ulong)(uint)data->fd);
    local_28 = MPP_NOK;
  }
  if ((drm_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_drm","leave dev %d\n","os_allocator_drm_import",
               (ulong)*(uint *)((long)ctx + 4));
  }
  return local_28;
}

Assistant:

static MPP_RET os_allocator_drm_import(void *ctx, MppBufferInfo *data)
{
    allocator_ctx_drm *p = (allocator_ctx_drm *)ctx;
    RK_S32 fd_ext = data->fd;
    MPP_RET ret = MPP_OK;

    drm_dbg_func("enter dev %d\n", p->drm_device);

    mpp_assert(fd_ext > 0);

    data->fd = mpp_dup(fd_ext);
    data->ptr = NULL;

    if (data->fd <= 0) {
        mpp_err_f(" fd dup return invalid fd %d\n", data->fd);
        ret = MPP_NOK;
    }

    drm_dbg_func("leave dev %d\n", p->drm_device);

    return ret;
}